

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveFile::CDirectiveFile(CDirectiveFile *this,Type type,ArgumentList *args)

{
  bool bVar1;
  GenericAssemblerFile *this_00;
  wchar_t *text;
  pointer strFilename;
  int virtualAddress;
  wstring fileName;
  wstring local_68;
  wstring originalName;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CAssemblerCommand_001759e0;
  this->type = type;
  this->file = (GenericAssemblerFile *)0x0;
  originalName._M_dataplus._M_p = (pointer)&originalName.field_2;
  originalName._M_string_length = 0;
  originalName.field_2._M_local_buf[0] = L'\0';
  fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
  fileName._M_string_length = 0;
  fileName.field_2._M_local_buf[0] = L'\0';
  switch(type) {
  case Open:
    getFullPathName(&local_68,
                    &((args->entries).
                      super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                      _M_impl.super__Vector_impl_data._M_start)->text);
    strFilename = (pointer)&fileName;
    std::__cxx11::wstring::operator=((wstring *)strFilename,(wstring *)&local_68);
    std::__cxx11::wstring::~wstring((wstring *)&local_68);
    bVar1 = fileExists((wstring *)strFilename);
    if (!bVar1) {
LAB_00142e37:
      text = L"File %s not found";
LAB_00142e57:
      Logger::printError<std::__cxx11::wstring>(FatalError,text,&strFilename->text);
      goto switchD_00142c92_caseD_3;
    }
    bVar1 = ConvertExpression(&(args->entries).
                               super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].text,&virtualAddress);
    if (!bVar1) goto LAB_00142e40;
    this_00 = (GenericAssemblerFile *)operator_new(0xa0);
    GenericAssemblerFile::GenericAssemblerFile(this_00,&fileName,virtualAddress,false);
    break;
  case Create:
    getFullPathName(&local_68,
                    &((args->entries).
                      super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                      _M_impl.super__Vector_impl_data._M_start)->text);
    std::__cxx11::wstring::operator=((wstring *)&fileName,(wstring *)&local_68);
    std::__cxx11::wstring::~wstring((wstring *)&local_68);
    bVar1 = ConvertExpression(&(args->entries).
                               super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].text,&virtualAddress);
    if (!bVar1) {
LAB_00142e40:
      strFilename = (args->entries).
                    super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
LAB_00142e50:
      text = L"Invalid ram address %s";
      goto LAB_00142e57;
    }
    this_00 = (GenericAssemblerFile *)operator_new(0xa0);
    GenericAssemblerFile::GenericAssemblerFile(this_00,&fileName,virtualAddress,true);
    break;
  case Copy:
    getFullPathName(&local_68,
                    &((args->entries).
                      super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                      _M_impl.super__Vector_impl_data._M_start)->text);
    std::__cxx11::wstring::operator=((wstring *)&originalName,(wstring *)&local_68);
    std::__cxx11::wstring::~wstring((wstring *)&local_68);
    getFullPathName(&local_68,
                    &(args->entries).
                     super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].text);
    std::__cxx11::wstring::operator=((wstring *)&fileName,(wstring *)&local_68);
    std::__cxx11::wstring::~wstring((wstring *)&local_68);
    strFilename = (pointer)&originalName;
    bVar1 = fileExists((wstring *)strFilename);
    if (!bVar1) goto LAB_00142e37;
    bVar1 = ConvertExpression(&(args->entries).
                               super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].text,&virtualAddress);
    if (!bVar1) {
      strFilename = (args->entries).
                    super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_start + 2;
      goto LAB_00142e50;
    }
    this_00 = (GenericAssemblerFile *)operator_new(0xa0);
    GenericAssemblerFile::GenericAssemblerFile(this_00,&fileName,&originalName,virtualAddress);
    break;
  case Close:
    goto switchD_00142c92_caseD_3;
  default:
    this_00 = (GenericAssemblerFile *)0x0;
    goto LAB_00142e16;
  }
  this->file = this_00;
LAB_00142e16:
  FileManager::addFile(g_fileManager,&this_00->super_AssemblerFile);
  Global.Section = Global.Section + 1;
switchD_00142c92_caseD_3:
  std::__cxx11::wstring::~wstring((wstring *)&fileName);
  std::__cxx11::wstring::~wstring((wstring *)&originalName);
  return;
}

Assistant:

CDirectiveFile::CDirectiveFile(Type type, ArgumentList& args)
	: type(type)
{
	file = NULL;
	
	std::wstring originalName;
	std::wstring fileName;
	int virtualAddress;

	switch (type)
	{
	case Type::Open:
		fileName = getFullPathName(args[0].text);

		if (fileExists(fileName) == false)
		{
			Logger::printError(Logger::FatalError,L"File %s not found",fileName);
			return;
		}
		if (ConvertExpression(args[1].text,virtualAddress) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid ram address %s",args[1].text);
			return;
		}

		file = new GenericAssemblerFile(fileName,virtualAddress,false);
		break;
	case Type::Create:
		fileName = getFullPathName(args[0].text);

		if (ConvertExpression(args[1].text,virtualAddress) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid ram address %s",args[1].text);
			return;
		}

		file = new GenericAssemblerFile(fileName,virtualAddress,true);
		break;
	case Type::Copy:
		originalName = getFullPathName(args[0].text);
		fileName = getFullPathName(args[1].text);

		if (fileExists(originalName) == false)
		{
			Logger::printError(Logger::FatalError,L"File %s not found",originalName);
			return;
		}
		if (ConvertExpression(args[2].text,virtualAddress) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid ram address %s",args[2].text);
			return;
		}

		file = new GenericAssemblerFile(fileName,originalName,virtualAddress);
		break;
	case Type::Close:
		return;
	}

	g_fileManager->addFile(file);
	Global.Section++;
}